

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::add
          (array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *this,CScaledGlyph *item)

{
  int new_len;
  vec4 *pvVar1;
  CScaledGlyph *pCVar2;
  CGlyph *pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  CScaledGlyph *pCVar6;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aVar7;
  anon_union_4_2_94730039_for_vector4_base<float>_5 aVar8;
  anon_union_4_2_94730017_for_vector4_base<float>_7 aVar9;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aVar10;
  anon_union_4_2_94730039_for_vector4_base<float>_5 aVar11;
  int iVar12;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar13;
  float fVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  
  uVar17 = this->list_size;
  uVar16 = this->num_elements;
  if (uVar16 == uVar17) {
    uVar17 = 1;
    if (1 < (int)uVar16) {
      uVar17 = uVar16 >> 1;
    }
    alloc(this,uVar17 + uVar16);
    uVar17 = this->list_size;
    uVar16 = this->num_elements;
  }
  new_len = uVar16 + 1;
  if ((int)uVar17 <= (int)uVar16) {
    alloc(this,new_len);
  }
  this->num_elements = new_len;
  pCVar2 = this->list;
  pCVar3 = item->m_pGlyph;
  fVar14 = item->m_Size;
  iVar15 = item->m_NumChars;
  iVar12 = item->m_Line;
  aVar13 = (item->m_Advance).field_0;
  uVar4 = *(undefined8 *)&(item->m_Advance).field_1;
  aVar10 = (item->m_TextColor).field_1;
  aVar11 = (item->m_TextColor).field_2;
  uVar5 = *(undefined8 *)&(item->m_TextColor).field_3;
  aVar7 = (item->m_SecondaryColor).field_1;
  aVar8 = (item->m_SecondaryColor).field_2;
  aVar9 = (item->m_SecondaryColor).field_3;
  pvVar1 = &pCVar2[(long)new_len + -1].m_SecondaryColor;
  pvVar1->field_0 = (item->m_SecondaryColor).field_0;
  pvVar1->field_1 = aVar7;
  pvVar1->field_2 = aVar8;
  pvVar1->field_3 = aVar9;
  pCVar6 = pCVar2 + (long)new_len + -1;
  (pCVar6->m_TextColor).field_1 = aVar10;
  (pCVar6->m_TextColor).field_2 = aVar11;
  *(undefined8 *)(&(pCVar6->m_TextColor).field_1 + 2) = uVar5;
  pCVar6 = pCVar2 + (long)new_len + -1;
  pCVar6->m_Line = iVar12;
  (pCVar6->m_Advance).field_0 = aVar13;
  *(undefined8 *)(&pCVar6->m_Line + 2) = uVar4;
  pCVar2 = pCVar2 + (long)new_len + -1;
  pCVar2->m_pGlyph = pCVar3;
  pCVar2->m_Size = fVar14;
  pCVar2->m_NumChars = iVar15;
  return this->num_elements + -1;
}

Assistant:

int add(const T& item)
	{
		incsize();
		set_size(size()+1);
		list[num_elements-1] = item;
		return num_elements-1;
	}